

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O2

string * __thiscall
duckdb::Leaf::DeprecatedVerifyAndToString_abi_cxx11_
          (string *__return_storage_ptr__,Leaf *this,ART *art,Node *node,bool only_verify)

{
  Node ptr;
  Leaf *pLVar1;
  uint8_t i;
  ulong uVar2;
  char local_bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string str;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::__cxx11::string::string((string *)&str,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_b0);
  while (ptr.super_IndexPointer.data = (IndexPointer)(art->super_BoundIndex).super_Index._vptr_Index
        , (ulong)ptr.super_IndexPointer.data >> 0x38 != 0) {
    pLVar1 = Node::Ref<duckdb::Leaf_const>((ART *)this,ptr,LEAF);
    ::std::__cxx11::to_string(&local_70,(uint)pLVar1->count);
    ::std::operator+(&local_50,"Leaf [count: ",&local_70);
    ::std::operator+(&local_b0,&local_50,", row IDs: ");
    ::std::__cxx11::string::append((string *)&str);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
    for (uVar2 = 0; uVar2 < pLVar1->count; uVar2 = uVar2 + 1) {
      ::std::__cxx11::to_string(&local_50,pLVar1->row_ids[uVar2]);
      ::std::operator+(&local_b0,&local_50,"-");
      ::std::__cxx11::string::append((string *)&str);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    ::std::__cxx11::string::append((char *)&str);
    art = (ART *)&pLVar1->ptr;
  }
  local_bc = (char)node;
  if (local_bc == '\0') {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&str);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_b0);
  }
  ::std::__cxx11::string::~string((string *)&str);
  return __return_storage_ptr__;
}

Assistant:

string Leaf::DeprecatedVerifyAndToString(ART &art, const Node &node, const bool only_verify) {
	D_ASSERT(node.GetType() == LEAF);

	string str = "";
	reference<const Node> ref(node);

	while (ref.get().HasMetadata()) {
		auto &leaf = Node::Ref<const Leaf>(art, ref, LEAF);
		D_ASSERT(leaf.count <= LEAF_SIZE);

		str += "Leaf [count: " + to_string(leaf.count) + ", row IDs: ";
		for (uint8_t i = 0; i < leaf.count; i++) {
			str += to_string(leaf.row_ids[i]) + "-";
		}
		str += "] ";
		ref = leaf.ptr;
	}

	return only_verify ? "" : str;
}